

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O1

bool MeCab::anon_unknown_20::connect<true>
               (size_t pos,Node *rnode,Node **begin_node_list,Node **end_node_list,
               Connector *connector,Allocator<mecab_node_t,_mecab_path_t> *allocator)

{
  mecab_node_t *pmVar1;
  long lVar2;
  mecab_path_t *pmVar3;
  long lVar4;
  long lVar5;
  mecab_node_t *pmVar6;
  mecab_node_t *pmVar7;
  bool bVar8;
  
  bVar8 = rnode == (Node *)0x0;
  while( true ) {
    if (bVar8) {
      return bVar8;
    }
    pmVar7 = begin_node_list[pos];
    if (pmVar7 == (mecab_node_t *)0x0) {
      lVar2 = 0x7fffffff;
      pmVar6 = (mecab_node_t *)0x0;
    }
    else {
      lVar2 = 0x7fffffff;
      pmVar6 = (mecab_node_t *)0x0;
      do {
        lVar4 = (long)rnode->wcost +
                (long)*(short *)((long)&end_node_list[3]->prev +
                                (ulong)((uint)rnode->lcAttr * (uint)*(ushort *)(end_node_list + 4) +
                                       (uint)pmVar7->rcAttr) * 2);
        lVar5 = lVar4 + pmVar7->cost;
        pmVar1 = pmVar7;
        if (lVar2 <= lVar5) {
          lVar5 = lVar2;
          pmVar1 = pmVar6;
        }
        pmVar6 = pmVar1;
        lVar2 = lVar5;
        pmVar3 = Allocator<mecab_node_t,_mecab_path_t>::newPath
                           ((Allocator<mecab_node_t,_mecab_path_t> *)connector);
        pmVar3->cost = (int)lVar4;
        pmVar3->rnode = rnode;
        pmVar3->lnode = pmVar7;
        pmVar3->lnext = rnode->lpath;
        rnode->lpath = pmVar3;
        pmVar3->rnext = pmVar7->rpath;
        pmVar7->rpath = pmVar3;
        pmVar7 = pmVar7->enext;
      } while (pmVar7 != (mecab_node_t *)0x0);
    }
    if (pmVar6 == (mecab_node_t *)0x0) break;
    rnode->prev = pmVar6;
    rnode->next = (mecab_node_t *)0x0;
    rnode->cost = lVar2;
    rnode->enext = begin_node_list[pos + rnode->rlength];
    begin_node_list[pos + rnode->rlength] = rnode;
    rnode = rnode->bnext;
    bVar8 = rnode == (mecab_node_t *)0x0;
  }
  return bVar8;
}

Assistant:

bool connect(size_t pos, Node *rnode,
                                       Node **begin_node_list,
                                       Node **end_node_list,
                                       const Connector *connector,
                                       Allocator<Node, Path> *allocator) {
  for (;rnode; rnode = rnode->bnext) {
    register long best_cost = 2147483647;
    Node* best_node = 0;
    for (Node *lnode = end_node_list[pos]; lnode; lnode = lnode->enext) {
      register int lcost = connector->cost(lnode, rnode);  // local cost
      register long cost = lnode->cost + lcost;

      if (cost < best_cost) {
        best_node  = lnode;
        best_cost  = cost;
  }

      if (IsAllPath) {
        Path *path   = allocator->newPath();
        path->cost   = lcost;
        path->rnode  = rnode;
        path->lnode  = lnode;
        path->lnext  = rnode->lpath;
        rnode->lpath = path;
        path->rnext  = lnode->rpath;
        lnode->rpath = path;
      }
    }

    // overflow check 2003/03/09
    if (!best_node) {
      return false;
  }

    rnode->prev = best_node;
    rnode->next = 0;
    rnode->cost = best_cost;
    const size_t x = rnode->rlength + pos;
    rnode->enext = end_node_list[x];
    end_node_list[x] = rnode;
  }

  return true;
  }